

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O3

pt_block_decoder * pt_blk_alloc_decoder(pt_config *config)

{
  int iVar1;
  pt_block_decoder *decoder;
  
  decoder = (pt_block_decoder *)malloc(0xa78);
  if (decoder != (pt_block_decoder *)0x0) {
    iVar1 = pt_blk_decoder_init(decoder,config);
    if (-1 < iVar1) {
      return decoder;
    }
    free(decoder);
  }
  return (pt_block_decoder *)0x0;
}

Assistant:

struct pt_block_decoder *
pt_blk_alloc_decoder(const struct pt_config *config)
{
	struct pt_block_decoder *decoder;
	int errcode;

	decoder = malloc(sizeof(*decoder));
	if (!decoder)
		return NULL;

	errcode = pt_blk_decoder_init(decoder, config);
	if (errcode < 0) {
		free(decoder);
		return NULL;
	}

	return decoder;
}